

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

void __thiscall
pstack::Procman::CoreProcess::CoreProcess(CoreProcess *this,Context *ctx,sptr *exec,sptr *core)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  size_type sVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  shared_ptr<const_pstack::Reader> local_2b0;
  shared_ptr<const_pstack::Reader> local_2a0;
  undefined1 local_290 [8];
  elf_prstatus task;
  undefined1 local_120 [8];
  NoteDesc note;
  iterator __end2;
  iterator local_c0 [8];
  iterator __begin2;
  Object *local_80;
  Object **local_78;
  Notes *__range2;
  undefined1 local_60 [24];
  shared_ptr<pstack::Reader> local_48;
  shared_ptr<pstack::Elf::Object> local_38;
  sptr *local_28;
  sptr *core_local;
  sptr *exec_local;
  Context *ctx_local;
  CoreProcess *this_local;
  
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_001f6dd0;
  local_28 = core;
  core_local = exec;
  exec_local = (sptr *)ctx;
  ctx_local = (Context *)this;
  std::shared_ptr<pstack::Elf::Object>::shared_ptr(&local_38,exec);
  local_60._0_8_ = this;
  std::
  make_shared<pstack::Procman::CoreReader,pstack::Procman::CoreProcess*,std::shared_ptr<pstack::Elf::Object>&>
            ((CoreProcess **)(local_60 + 8),(shared_ptr<pstack::Elf::Object> *)local_60);
  std::shared_ptr<pstack::Reader>::shared_ptr<pstack::Procman::CoreReader,void>
            (&local_48,(shared_ptr<pstack::Procman::CoreReader> *)(local_60 + 8));
  Process::Process(&this->super_Process,ctx,&local_38,&local_48);
  std::shared_ptr<pstack::Reader>::~shared_ptr(&local_48);
  std::shared_ptr<pstack::Procman::CoreReader>::~shared_ptr
            ((shared_ptr<pstack::Procman::CoreReader> *)(local_60 + 8));
  std::shared_ptr<pstack::Elf::Object>::~shared_ptr(&local_38);
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_001f6dd0;
  std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::vector(&this->notes);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map(&this->lwpToPrStatusIdx);
  (this->prpsinfo).pr_psargs[0x38] = '\0';
  (this->prpsinfo).pr_psargs[0x39] = '\0';
  (this->prpsinfo).pr_psargs[0x3a] = '\0';
  (this->prpsinfo).pr_psargs[0x3b] = '\0';
  (this->prpsinfo).pr_psargs[0x3c] = '\0';
  (this->prpsinfo).pr_psargs[0x3d] = '\0';
  (this->prpsinfo).pr_psargs[0x3e] = '\0';
  (this->prpsinfo).pr_psargs[0x3f] = '\0';
  (this->prpsinfo).pr_psargs[0x40] = '\0';
  (this->prpsinfo).pr_psargs[0x41] = '\0';
  (this->prpsinfo).pr_psargs[0x42] = '\0';
  (this->prpsinfo).pr_psargs[0x43] = '\0';
  (this->prpsinfo).pr_psargs[0x44] = '\0';
  (this->prpsinfo).pr_psargs[0x45] = '\0';
  (this->prpsinfo).pr_psargs[0x46] = '\0';
  (this->prpsinfo).pr_psargs[0x47] = '\0';
  (this->prpsinfo).pr_psargs[0x28] = '\0';
  (this->prpsinfo).pr_psargs[0x29] = '\0';
  (this->prpsinfo).pr_psargs[0x2a] = '\0';
  (this->prpsinfo).pr_psargs[0x2b] = '\0';
  (this->prpsinfo).pr_psargs[0x2c] = '\0';
  (this->prpsinfo).pr_psargs[0x2d] = '\0';
  (this->prpsinfo).pr_psargs[0x2e] = '\0';
  (this->prpsinfo).pr_psargs[0x2f] = '\0';
  (this->prpsinfo).pr_psargs[0x30] = '\0';
  (this->prpsinfo).pr_psargs[0x31] = '\0';
  (this->prpsinfo).pr_psargs[0x32] = '\0';
  (this->prpsinfo).pr_psargs[0x33] = '\0';
  (this->prpsinfo).pr_psargs[0x34] = '\0';
  (this->prpsinfo).pr_psargs[0x35] = '\0';
  (this->prpsinfo).pr_psargs[0x36] = '\0';
  (this->prpsinfo).pr_psargs[0x37] = '\0';
  (this->prpsinfo).pr_psargs[0x18] = '\0';
  (this->prpsinfo).pr_psargs[0x19] = '\0';
  (this->prpsinfo).pr_psargs[0x1a] = '\0';
  (this->prpsinfo).pr_psargs[0x1b] = '\0';
  (this->prpsinfo).pr_psargs[0x1c] = '\0';
  (this->prpsinfo).pr_psargs[0x1d] = '\0';
  (this->prpsinfo).pr_psargs[0x1e] = '\0';
  (this->prpsinfo).pr_psargs[0x1f] = '\0';
  (this->prpsinfo).pr_psargs[0x20] = '\0';
  (this->prpsinfo).pr_psargs[0x21] = '\0';
  (this->prpsinfo).pr_psargs[0x22] = '\0';
  (this->prpsinfo).pr_psargs[0x23] = '\0';
  (this->prpsinfo).pr_psargs[0x24] = '\0';
  (this->prpsinfo).pr_psargs[0x25] = '\0';
  (this->prpsinfo).pr_psargs[0x26] = '\0';
  (this->prpsinfo).pr_psargs[0x27] = '\0';
  (this->prpsinfo).pr_psargs[8] = '\0';
  (this->prpsinfo).pr_psargs[9] = '\0';
  (this->prpsinfo).pr_psargs[10] = '\0';
  (this->prpsinfo).pr_psargs[0xb] = '\0';
  (this->prpsinfo).pr_psargs[0xc] = '\0';
  (this->prpsinfo).pr_psargs[0xd] = '\0';
  (this->prpsinfo).pr_psargs[0xe] = '\0';
  (this->prpsinfo).pr_psargs[0xf] = '\0';
  (this->prpsinfo).pr_psargs[0x10] = '\0';
  (this->prpsinfo).pr_psargs[0x11] = '\0';
  (this->prpsinfo).pr_psargs[0x12] = '\0';
  (this->prpsinfo).pr_psargs[0x13] = '\0';
  (this->prpsinfo).pr_psargs[0x14] = '\0';
  (this->prpsinfo).pr_psargs[0x15] = '\0';
  (this->prpsinfo).pr_psargs[0x16] = '\0';
  (this->prpsinfo).pr_psargs[0x17] = '\0';
  (this->prpsinfo).pr_fname[8] = '\0';
  (this->prpsinfo).pr_fname[9] = '\0';
  (this->prpsinfo).pr_fname[10] = '\0';
  (this->prpsinfo).pr_fname[0xb] = '\0';
  (this->prpsinfo).pr_fname[0xc] = '\0';
  (this->prpsinfo).pr_fname[0xd] = '\0';
  (this->prpsinfo).pr_fname[0xe] = '\0';
  (this->prpsinfo).pr_fname[0xf] = '\0';
  (this->prpsinfo).pr_psargs[0] = '\0';
  (this->prpsinfo).pr_psargs[1] = '\0';
  (this->prpsinfo).pr_psargs[2] = '\0';
  (this->prpsinfo).pr_psargs[3] = '\0';
  (this->prpsinfo).pr_psargs[4] = '\0';
  (this->prpsinfo).pr_psargs[5] = '\0';
  (this->prpsinfo).pr_psargs[6] = '\0';
  (this->prpsinfo).pr_psargs[7] = '\0';
  (this->prpsinfo).pr_pgrp = 0;
  (this->prpsinfo).pr_sid = 0;
  (this->prpsinfo).pr_fname[0] = '\0';
  (this->prpsinfo).pr_fname[1] = '\0';
  (this->prpsinfo).pr_fname[2] = '\0';
  (this->prpsinfo).pr_fname[3] = '\0';
  (this->prpsinfo).pr_fname[4] = '\0';
  (this->prpsinfo).pr_fname[5] = '\0';
  (this->prpsinfo).pr_fname[6] = '\0';
  (this->prpsinfo).pr_fname[7] = '\0';
  (this->prpsinfo).pr_uid = 0;
  (this->prpsinfo).pr_gid = 0;
  (this->prpsinfo).pr_pid = 0;
  (this->prpsinfo).pr_ppid = 0;
  (this->prpsinfo).pr_state = '\0';
  (this->prpsinfo).pr_sname = '\0';
  (this->prpsinfo).pr_zomb = '\0';
  (this->prpsinfo).pr_nice = '\0';
  *(undefined4 *)&(this->prpsinfo).field_0x4 = 0;
  (this->prpsinfo).pr_flag = 0;
  (this->prpsinfo).pr_psargs[0x48] = '\0';
  (this->prpsinfo).pr_psargs[0x49] = '\0';
  (this->prpsinfo).pr_psargs[0x4a] = '\0';
  (this->prpsinfo).pr_psargs[0x4b] = '\0';
  (this->prpsinfo).pr_psargs[0x4c] = '\0';
  (this->prpsinfo).pr_psargs[0x4d] = '\0';
  (this->prpsinfo).pr_psargs[0x4e] = '\0';
  (this->prpsinfo).pr_psargs[0x4f] = '\0';
  std::shared_ptr<pstack::Elf::Object>::shared_ptr(&this->coreImage,core);
  this_00 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->coreImage);
  local_80 = (Object *)Elf::Object::notes(this_00);
  local_78 = &local_80;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  while (bVar1 = Elf::Notes::iterator::operator!=
                           (local_c0,(iterator *)
                                     &note.io.
                                      super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount), bVar1) {
    Elf::Notes::iterator::operator*((NoteDesc *)local_120,local_c0);
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &task.pr_fpvalid,"CORE");
    std::__cxx11::string::~string((string *)&task.pr_fpvalid);
    if (bVar1) {
      iVar2 = Elf::NoteDesc::type((NoteDesc *)local_120);
      if (iVar2 == 1) {
        pstack::Elf::NoteDesc::data();
        peVar5 = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_2a0);
        Reader::readObj<elf_prstatus>((elf_prstatus *)local_290,peVar5,0);
        std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_2a0);
        sVar3 = std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::size
                          (&this->notes);
        pmVar4 = std::
                 map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                 ::operator[](&this->lwpToPrStatusIdx,(key_type *)&task.pr_sighold);
        *pmVar4 = sVar3;
      }
      else if (iVar2 == 3) {
        pstack::Elf::NoteDesc::data();
        peVar5 = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_2b0);
        Reader::readObj<elf_prpsinfo>(peVar5,0,&this->prpsinfo,1);
        std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_2b0);
      }
    }
    std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::push_back
              (&this->notes,(value_type *)local_120);
    Elf::NoteDesc::~NoteDesc((NoteDesc *)local_120);
    pstack::Elf::Notes::iterator::operator++(local_c0);
  }
  Elf::Notes::iterator::~iterator
            ((iterator *)
             &note.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Elf::Notes::iterator::~iterator(local_c0);
  return;
}

Assistant:

CoreProcess::CoreProcess(Context &ctx, Elf::Object::sptr exec, Elf::Object::sptr core)
   : Process(ctx, std::move(exec), std::make_shared<CoreReader>(this, core))
     , prpsinfo{}
     , coreImage(std::move(core))
{
   for (auto note : coreImage->notes()) {
      if (note.name() == "CORE") {
         switch  (note.type() ) {
            case NT_PRSTATUS: {
               // for NT_PRSTATUS notes, mark the index of the current note in our
               // vector as the start of the notes for that LWP. When looking
               // for an LWP-related note, we start at the index for that LWPs
               // NT_PRSTATUS, and consider it a failure if we reach another
               // NT_PRSTATUS or the end of the list.
               auto task = note.data()->readObj<prstatus_t>(0);
               lwpToPrStatusIdx[task.pr_pid] = notes.size();
               break;
            }
            case NT_PRPSINFO: {
               note.data()->readObj(0, &prpsinfo); // hold on to a copy of this
               break;
            }
            default:
               break;
         }
      }
      notes.push_back( note );
   }
}